

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O1

void Acb_ObjAddFaninFanoutOne(Acb_Ntk_t *p,int iObj,int iFanin)

{
  int iVar1;
  int *piVar2;
  
  if ((iFanin < 0) || ((p->vFanouts).nSize <= iFanin)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                  ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  Vec_IntPush((p->vFanouts).pArray + (uint)iFanin,iObj);
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
  }
  if ((p->vObjFans).nSize <= iObj) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar1 = (p->vObjFans).pArray[(uint)iObj];
  if (((long)iVar1 < 0) || ((p->vFanSto).nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  if (iFanin == 0) {
    __assert_fail("iFanin > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0x1a3,"void Acb_ObjAddFanin(Acb_Ntk_t *, int, int)");
  }
  piVar2 = (p->vFanSto).pArray + iVar1;
  iVar1 = *piVar2;
  if (piVar2[(long)iVar1 + 1] == -1) {
    *piVar2 = iVar1 + 1;
    piVar2[(long)iVar1 + 1] = iFanin;
    return;
  }
  __assert_fail("pFanins[ 1 + pFanins[0] ] == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                ,0x1a4,"void Acb_ObjAddFanin(Acb_Ntk_t *, int, int)");
}

Assistant:

static inline void Acb_ObjAddFaninFanoutOne( Acb_Ntk_t * p, int iObj, int iFanin )
{
    Vec_IntPush( Vec_WecEntry(&p->vFanouts, iFanin), iObj );
    Acb_ObjAddFanin( p, iObj, iFanin );
}